

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

ggml_tensor * ggml_add_impl(ggml_context *ctx,ggml_tensor *a,ggml_tensor *b,_Bool inplace)

{
  byte bVar1;
  _Bool _Var2;
  ggml_tensor *pgVar3;
  byte in_CL;
  ggml_tensor *in_RDX;
  ggml_tensor *in_RSI;
  ggml_tensor *result;
  ggml_tensor *in_stack_ffffffffffffffc8;
  ggml_tensor *in_stack_ffffffffffffffd0;
  ggml_tensor *in_stack_ffffffffffffffd8;
  undefined7 in_stack_ffffffffffffffe0;
  
  bVar1 = in_CL & 1;
  _Var2 = ggml_can_repeat(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  if (!_Var2) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml.c"
               ,0x743,"GGML_ASSERT(%s) failed","ggml_can_repeat(b, a)");
  }
  if ((bVar1 & 1) == 0) {
    pgVar3 = ggml_dup_tensor((ggml_context *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  }
  else {
    pgVar3 = ggml_view_tensor((ggml_context *)CONCAT17(bVar1,in_stack_ffffffffffffffe0),
                              in_stack_ffffffffffffffd8);
  }
  pgVar3->op = GGML_OP_ADD;
  pgVar3->src[0] = in_RSI;
  pgVar3->src[1] = in_RDX;
  return pgVar3;
}

Assistant:

static struct ggml_tensor * ggml_add_impl(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        struct ggml_tensor  * b,
        bool                  inplace) {
    GGML_ASSERT(ggml_can_repeat(b, a));

    struct ggml_tensor * result = inplace ? ggml_view_tensor(ctx, a) : ggml_dup_tensor(ctx, a);

    result->op     = GGML_OP_ADD;
    result->src[0] = a;
    result->src[1] = b;

    return result;
}